

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StringRef.h
# Opt level: O3

uint __thiscall llvm::ARM::getDefaultExtensions(ARM *this,StringRef CPU,ArchKind AK)

{
  long lVar1;
  uint uVar2;
  ushort uVar3;
  ulong uVar4;
  ulong uVar5;
  
  switch(CPU.Data + -4) {
  case (char *)0x0:
    if (*(int *)this == 0x326d7261) {
      return 1;
    }
    if (*(int *)this == 0x336d7261) {
      return 1;
    }
    if (*(int *)this == 0x366d7261) {
      return 1;
    }
    if (*(int *)this == 0x386d7261) {
      return 1;
    }
    goto code_r0x00180941;
  case (char *)0x1:
    uVar2 = *(uint *)this ^ 0x376d7261;
    uVar3 = (byte)this[4] ^ 0x6d;
    break;
  case (char *)0x2:
    uVar2 = *(uint *)this ^ 0x386d7261;
    uVar3 = *(ushort *)(this + 4) ^ 0x3031;
    break;
  case (char *)0x3:
    if (*(int *)(this + 3) == 0x63697265 && *(int *)this == 0x656e6567) {
      return *(uint *)(&DAT_001d1784 + (CPU.Length & 0xffffffff) * 0x40);
    }
    goto switchD_0018094f_caseD_3;
  case (char *)0x4:
    if (*(long *)this == 0x696d6474376d7261) {
      return 1;
    }
    if (*(long *)this == 0x696d6474396d7261) {
      return 1;
    }
    if (*(long *)this == 0x74303230316d7261) {
      return 1;
    }
    if (*(long *)this != 0x65303230316d7261) {
      if (*(long *)this != 0x65323230316d7261) {
        return 0;
      }
      return 0x401;
    }
    return 0x401;
  case (char *)0x5:
    lVar1 = *(long *)this;
    uVar2 = (byte)this[8] ^ 0x6d;
    goto LAB_0018092e;
  case (char *)0x6:
    goto switchD_001807d3_caseD_6;
  case (char *)0x7:
    goto switchD_001807d3_caseD_7;
  case (char *)0x8:
    lVar1 = *(long *)this;
    uVar2 = *(uint *)(this + 8) ^ 0x3031316d;
LAB_0018092e:
    if (uVar2 == 0 && lVar1 == 0x7261676e6f727473) {
      return 1;
    }
    goto code_r0x00180941;
  case (char *)0x9:
    if (*(long *)(this + 5) == 0x303031316d726167 && *(long *)this == 0x7261676e6f727473) {
      return 1;
    }
    if (*(long *)(this + 5) == 0x303131316d726167 && *(long *)this == 0x7261676e6f727473) {
      return 1;
    }
    goto switchD_0018094f_caseD_9;
  default:
    goto switchD_001807d3_default;
  }
  if (uVar3 == 0 && uVar2 == 0) {
    return 1;
  }
code_r0x00180941:
  switch(CPU.Data + -4) {
  case (char *)0x0:
    if (*(int *)this == 0x396d7261) {
      return 1;
    }
    if (*(int *)this == 0x6f79726b) {
      return 0x772;
    }
    break;
  case (char *)0x1:
    if (this[4] == (ARM)0x65 && *(int *)this == 0x396d7261) {
      return 0x401;
    }
    if (this[4] == (ARM)0x30 && *(int *)this == 0x30306373) {
      return 1;
    }
    if (this[4] == (ARM)0x74 && *(int *)this == 0x6961726b) {
      return 0x430;
    }
    if (this[4] != (ARM)0x30 || *(int *)this != 0x30336373) {
      if (this[4] == (ARM)0x74 && *(int *)this == 0x66697773) {
        return 0x430;
      }
      return 0;
    }
    return 0x11;
  case (char *)0x2:
    if (*(short *)(this + 4) == 0x3032 && *(int *)this == 0x396d7261) {
      return 1;
    }
    if (*(short *)(this + 4) == 0x3231 && *(int *)this == 0x33397065) {
      return 1;
    }
    if (*(short *)(this + 4) == 0x6530 && *(int *)this == 0x316d7261) {
      return 0x401;
    }
    if (*(short *)(this + 4) == 0x6572 && *(int *)this == 0x6f63706d) {
      return 0x401;
    }
    if (*(short *)(this + 4) == 0x7478 && *(int *)this == 0x6d6d7769) {
      return 1;
    }
    if (*(short *)(this + 4) == 0x656c && *(int *)this == 0x61637378) {
      return 1;
    }
    return 0;
  case (char *)0x3:
switchD_0018094f_caseD_3:
    if (*(int *)(this + 3) == 0x74303137 && *(int *)this == 0x376d7261) {
      return 1;
    }
    if (*(int *)(this + 3) == 0x74303237 && *(int *)this == 0x376d7261) {
      return 1;
    }
    if (*(int *)(this + 3) == 0x74303239 && *(int *)this == 0x396d7261) {
      return 1;
    }
    if (*(int *)(this + 3) == 0x74323239 && *(int *)this == 0x396d7261) {
      return 1;
    }
    if (*(int *)(this + 3) == 0x32313339 && *(int *)this == 0x396d7261) {
      return 1;
    }
    if (*(int *)(this + 3) == 0x74303439 && *(int *)this == 0x396d7261) {
      return 1;
    }
    if (*(int *)(this + 3) == 0x656e6f6c && *(int *)this == 0x6c637963) {
      return 0x772;
    }
    return (uint)(*(int *)(this + 3) == 0x64696c61 && *(int *)this == 0x61766e69);
  case (char *)0x5:
    if (this[8] == (ARM)0x69 && *(long *)this == 0x6d647430316d7261) {
      return 1;
    }
    if (this[8] == (ARM)0x73 && *(long *)this == 0x2d653634396d7261) {
      return 0x401;
    }
    if (this[8] == (ARM)0x73 && *(long *)this == 0x2d653636396d7261) {
      return 0x401;
    }
    if (this[8] == (ARM)0x73 && *(long *)this == 0x2d653836396d7261) {
      return 0x401;
    }
    if (this[8] == (ARM)0x30 && *(long *)this == 0x6d2d786574726f63) {
      return 1;
    }
    if (this[8] == (ARM)0x31 && *(long *)this == 0x6d2d786574726f63) {
      return 1;
    }
    if (this[8] == (ARM)0x35 && *(long *)this == 0x612d786574726f63) {
      return 0x540;
    }
    if (this[8] == (ARM)0x37 && *(long *)this == 0x612d786574726f63) {
      return 0x770;
    }
    if (this[8] == (ARM)0x38 && *(long *)this == 0x612d786574726f63) {
      return 0x500;
    }
    if (this[8] == (ARM)0x39 && *(long *)this == 0x612d786574726f63) {
      return 0x540;
    }
    if (this[8] == (ARM)0x34 && *(long *)this == 0x722d786574726f63) {
      return 0x411;
    }
    if (this[8] == (ARM)0x35 && *(long *)this == 0x722d786574726f63) {
      return 0x470;
    }
    if (this[8] == (ARM)0x37 && *(long *)this == 0x722d786574726f63) {
      return 0x470;
    }
    if (this[8] == (ARM)0x38 && *(long *)this == 0x722d786574726f63) {
      return 0x470;
    }
    if (this[8] == (ARM)0x33 && *(long *)this == 0x6d2d786574726f63) {
      return 0x11;
    }
    if (this[8] == (ARM)0x34 && *(long *)this == 0x6d2d786574726f63) {
      return 0x411;
    }
    if (this[8] == (ARM)0x37 && *(long *)this == 0x6d2d786574726f63) {
      return 0x411;
    }
    uVar2 = 0x772;
    if (this[8] == (ARM)0x31 && *(long *)this == 0x6d2d736f6e797865) {
      return 0x772;
    }
    if (this[8] == (ARM)0x32 && *(long *)this == 0x6d2d736f6e797865) {
      return 0x772;
    }
    if (this[8] == (ARM)0x33 && *(long *)this == 0x6d2d736f6e797865) {
      return 0x772;
    }
    uVar4 = *(ulong *)this ^ 0x6d2d736f6e797865;
    uVar5 = (ulong)(byte)this[8] ^ 0x34;
    goto LAB_00180c4e;
  case (char *)0x6:
switchD_001807d3_caseD_6:
    if (*(short *)(this + 8) == 0x732d && *(long *)this == 0x696d6474376d7261) {
      return 1;
    }
    if (*(short *)(this + 8) == 0x732d && *(long *)this == 0x6a653632396d7261) {
      return 0x401;
    }
    if (*(short *)(this + 8) == 0x732d && *(long *)this == 0x6a363331316d7261) {
      return 0x401;
    }
    if (*(short *)(this + 8) == 0x732d && *(long *)this == 0x6a363731316d7261) {
      return 0x401;
    }
    if (*(short *)(this + 8) == 0x3231 && *(long *)this == 0x612d786574726f63) {
      return 0x770;
    }
    if (*(short *)(this + 8) == 0x3531 && *(long *)this == 0x612d786574726f63) {
      return 0x770;
    }
    if (*(short *)(this + 8) == 0x3731 && *(long *)this == 0x612d786574726f63) {
      return 0x770;
    }
    if (*(short *)(this + 8) == 0x6634 && *(long *)this == 0x722d786574726f63) {
      return 0x411;
    }
    if (*(short *)(this + 8) == 0x3235 && *(long *)this == 0x722d786574726f63) {
      return 0x673;
    }
    if (*(short *)(this + 8) == 0x3332 && *(long *)this == 0x6d2d786574726f63) {
      return 0x11;
    }
    if (*(short *)(this + 8) == 0x3333 && *(long *)this == 0x6d2d786574726f63) {
      return 0x410;
    }
    if (*(short *)(this + 8) == 0x3233 && *(long *)this == 0x612d786574726f63) {
      return 0x772;
    }
    if (*(short *)(this + 8) == 0x3533 && *(long *)this == 0x612d786574726f63) {
      return 0x772;
    }
    if (*(short *)(this + 8) == 0x3335 && *(long *)this == 0x612d786574726f63) {
      return 0x772;
    }
    if (*(short *)(this + 8) == 0x3535 && *(long *)this == 0x612d786574726f63) {
      return 0x5f72;
    }
    if (*(short *)(this + 8) == 0x3735 && *(long *)this == 0x612d786574726f63) {
      return 0x772;
    }
    if (*(short *)(this + 8) == 0x3237 && *(long *)this == 0x612d786574726f63) {
      return 0x772;
    }
    if (*(short *)(this + 8) == 0x3337 && *(long *)this == 0x612d786574726f63) {
      return 0x772;
    }
    if (*(short *)(this + 8) == 0x3537 && *(long *)this == 0x612d786574726f63) {
      return 0x5f72;
    }
    return 0;
  case (char *)0x7:
switchD_001807d3_caseD_7:
    uVar2 = 0x401;
    if (*(long *)(this + 3) == 0x732d666a36333131 && *(long *)this == 0x6a363331316d7261) {
      return 0x401;
    }
    if (*(long *)(this + 3) == 0x732d7a6a36333131 && *(long *)this == 0x6a363331316d7261) {
      return 0x401;
    }
    if (*(long *)(this + 3) == 0x732d7a6a36373131 && *(long *)this == 0x6a363731316d7261) {
      return 0x501;
    }
    if (*(long *)(this + 3) == 0x7066766f6e65726f && *(long *)this == 0x6f6e65726f63706d) {
      return 0x401;
    }
    uVar4 = *(ulong *)this ^ 0x74363531316d7261;
    uVar5 = *(ulong *)(this + 3) ^ 0x732d327436353131;
LAB_00180c4e:
    if (uVar5 == 0 && uVar4 == 0) {
      return uVar2;
    }
    break;
  case (char *)0x8:
    if (*(int *)(this + 8) == 0x732d667a && *(long *)this == 0x6a363731316d7261) {
      return 0x501;
    }
    if (*(int *)(this + 8) == 0x732d6632 && *(long *)this == 0x74363531316d7261) {
      return 0x401;
    }
    break;
  case (char *)0x9:
switchD_0018094f_caseD_9:
    if (*(long *)(this + 5) == 0x73756c70306d2d78 && *(long *)this == 0x6d2d786574726f63) {
      return 1;
    }
  }
switchD_001807d3_default:
  return 0;
}

Assistant:

bool equals(StringRef RHS) const {
      return (Length == RHS.Length &&
              compareMemory(Data, RHS.Data, RHS.Length) == 0);
    }